

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<sophia_interface,_std::shared_ptr<sophia_interface>_> * __thiscall
pybind11::class_<sophia_interface,std::shared_ptr<sophia_interface>>::
def<sophiaevent_output(sophia_interface::*)(bool,double,double,bool),pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v>
          (class_<sophia_interface,std::shared_ptr<sophia_interface>> *this,char *name_,
          offset_in_sophia_interface_to_subr *f,arg *extra,arg *extra_1,arg *extra_2,arg_v *extra_3)

{
  offset_in_sophia_interface_to_subr f_00;
  name *extra_00;
  undefined1 local_80 [8];
  obj_attr_accessor local_78;
  arg *local_58;
  object local_50;
  handle local_48;
  cpp_function local_40;
  cpp_function cf;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  cf.super_function.super_object.super_handle.m_ptr = *(function *)this;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_78._0_8_ = name_;
  local_58 = extra;
  getattr((pybind11 *)&local_48,(handle)cf.super_function.super_object.super_handle.m_ptr,name_,
          (PyObject *)&_Py_NoneStruct);
  local_80 = (undefined1  [8])local_48.m_ptr;
  cpp_function::
  cpp_function<sophiaevent_output,sophia_interface,bool,double,double,bool,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v>
            (&local_40,f_00,extra_00,(is_method *)&local_78,(sibling *)&cf,(arg *)local_80,local_58,
             extra_1,(arg_v *)extra_2);
  object::~object((object *)&local_48);
  object::~object(&local_50);
  cpp_function::name(&cf);
  detail::object_api<pybind11::handle>::attr
            (&local_78,(object_api<pybind11::handle> *)this,
             (handle)cf.super_function.super_object.super_handle.m_ptr);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_78,&local_40);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_78);
  object::~object((object *)&cf);
  object::~object((object *)&local_40);
  return (class_<sophia_interface,_std::shared_ptr<sophia_interface>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }